

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eltwise_x86_avx.cpp
# Opt level: O3

int __thiscall
ncnn::Eltwise_x86_avx::forward
          (Eltwise_x86_avx *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  float fVar5;
  uint uVar6;
  int iVar7;
  Mat *m;
  Mat *this_00;
  size_t sVar8;
  _func_int **pp_Var9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  size_t sVar14;
  _func_int *p_Var15;
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  pointer pMVar29;
  ulong uVar30;
  pointer pMVar31;
  ulong uVar32;
  ulong uVar33;
  void *pvVar34;
  void *pvVar35;
  int iVar36;
  long lVar37;
  void *pvVar38;
  long lVar39;
  ulong uVar40;
  int iVar41;
  uint uVar42;
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  float in_register_0000125c;
  float in_register_0000129c;
  float in_register_000012dc;
  
  m = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
      super__Vector_impl_data._M_start;
  iVar36 = m->elempack;
  uVar6 = m->c;
  uVar33 = (ulong)uVar6;
  iVar41 = m->h * m->w;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  Mat::create_like(this_00,m,opt->blob_allocator);
  pvVar34 = this_00->data;
  if (pvVar34 == (void *)0x0) {
    return -100;
  }
  sVar8 = this_00->cstep;
  if ((long)this_00->c * sVar8 != 0) {
    pp_Var9 = this->_vptr_Eltwise_x86_avx;
    iVar7 = *(int *)(&this->field_0xd0 + (long)pp_Var9[-3]);
    if (iVar36 == 4) {
      if (iVar7 == 0) {
        pMVar31 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (0 < (int)uVar6) {
          uVar32 = 0;
          do {
            if (0 < iVar41) {
              sVar8 = this_00->cstep;
              sVar10 = pMVar31[1].cstep;
              sVar11 = this_00->elemsize;
              pvVar34 = this_00->data;
              sVar12 = pMVar31[1].elemsize;
              pvVar35 = pMVar31[1].data;
              sVar13 = m->cstep;
              sVar14 = m->elemsize;
              pvVar38 = m->data;
              lVar37 = 0;
              iVar36 = iVar41;
              do {
                pfVar1 = (float *)((long)pvVar35 + lVar37 + sVar10 * sVar12 * uVar32);
                pfVar2 = (float *)((long)pvVar38 + lVar37 + sVar13 * sVar14 * uVar32);
                auVar43._0_4_ = *pfVar1 * *pfVar2;
                auVar43._4_4_ = pfVar1[1] * pfVar2[1];
                auVar43._8_4_ = pfVar1[2] * pfVar2[2];
                auVar43._12_4_ = pfVar1[3] * pfVar2[3];
                *(undefined1 (*) [16])((long)pvVar34 + lVar37 + sVar8 * sVar11 * uVar32) = auVar43;
                lVar37 = lVar37 + 0x10;
                iVar36 = iVar36 + -1;
              } while (iVar36 != 0);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar33);
          pMVar31 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        }
        pMVar29 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        if (2 < (ulong)(((long)pMVar29 - (long)pMVar31 >> 3) * -0x71c71c71c71c71c7)) {
          uVar32 = 2;
          do {
            if (0 < (int)uVar6) {
              pMVar31 = pMVar31 + uVar32;
              uVar30 = 0;
              do {
                if (0 < iVar41) {
                  lVar37 = this_00->cstep * this_00->elemsize * uVar30;
                  pvVar34 = this_00->data;
                  sVar8 = pMVar31->cstep;
                  sVar10 = pMVar31->elemsize;
                  pvVar35 = pMVar31->data;
                  lVar39 = 0;
                  iVar36 = iVar41;
                  do {
                    pfVar1 = (float *)((long)pvVar35 + lVar39 + sVar8 * sVar10 * uVar30);
                    pfVar2 = (float *)((long)pvVar34 + lVar39 + lVar37);
                    auVar44._0_4_ = *pfVar1 * *pfVar2;
                    auVar44._4_4_ = pfVar1[1] * pfVar2[1];
                    auVar44._8_4_ = pfVar1[2] * pfVar2[2];
                    auVar44._12_4_ = pfVar1[3] * pfVar2[3];
                    *(undefined1 (*) [16])((long)pvVar34 + lVar39 + lVar37) = auVar44;
                    lVar39 = lVar39 + 0x10;
                    iVar36 = iVar36 + -1;
                  } while (iVar36 != 0);
                }
                uVar30 = uVar30 + 1;
              } while (uVar30 != uVar33);
              pMVar31 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              pMVar29 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 < (ulong)(((long)pMVar29 - (long)pMVar31 >> 3) * -0x71c71c71c71c71c7));
        }
      }
      p_Var15 = pp_Var9[-3];
      if (*(int *)(&this->field_0xd0 + (long)p_Var15) == 1) {
        pMVar31 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (*(int *)(&this->field_0x104 + (long)p_Var15) == 0) {
          if (0 < (int)uVar6) {
            uVar32 = 0;
            do {
              if (0 < iVar41) {
                sVar8 = this_00->cstep;
                sVar10 = pMVar31[1].cstep;
                sVar11 = this_00->elemsize;
                pvVar34 = this_00->data;
                sVar12 = pMVar31[1].elemsize;
                pvVar35 = pMVar31[1].data;
                sVar13 = m->cstep;
                sVar14 = m->elemsize;
                pvVar38 = m->data;
                lVar37 = 0;
                iVar36 = iVar41;
                do {
                  pfVar1 = (float *)((long)pvVar35 + lVar37 + sVar10 * sVar12 * uVar32);
                  pfVar2 = (float *)((long)pvVar38 + lVar37 + sVar13 * sVar14 * uVar32);
                  auVar45._0_4_ = *pfVar1 + *pfVar2;
                  auVar45._4_4_ = pfVar1[1] + pfVar2[1];
                  auVar45._8_4_ = pfVar1[2] + pfVar2[2];
                  auVar45._12_4_ = pfVar1[3] + pfVar2[3];
                  *(undefined1 (*) [16])((long)pvVar34 + lVar37 + sVar8 * sVar11 * uVar32) = auVar45
                  ;
                  lVar37 = lVar37 + 0x10;
                  iVar36 = iVar36 + -1;
                } while (iVar36 != 0);
              }
              uVar32 = uVar32 + 1;
            } while (uVar32 != uVar33);
            pMVar31 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          }
          pMVar29 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          if (2 < (ulong)(((long)pMVar29 - (long)pMVar31 >> 3) * -0x71c71c71c71c71c7)) {
            uVar32 = 2;
            do {
              if (0 < (int)uVar6) {
                pMVar31 = pMVar31 + uVar32;
                uVar30 = 0;
                do {
                  if (0 < iVar41) {
                    lVar37 = this_00->cstep * this_00->elemsize * uVar30;
                    pvVar34 = this_00->data;
                    sVar8 = pMVar31->cstep;
                    sVar10 = pMVar31->elemsize;
                    pvVar35 = pMVar31->data;
                    lVar39 = 0;
                    iVar36 = iVar41;
                    do {
                      pfVar1 = (float *)((long)pvVar35 + lVar39 + sVar8 * sVar10 * uVar30);
                      pfVar2 = (float *)((long)pvVar34 + lVar39 + lVar37);
                      auVar46._0_4_ = *pfVar1 + *pfVar2;
                      auVar46._4_4_ = pfVar1[1] + pfVar2[1];
                      auVar46._8_4_ = pfVar1[2] + pfVar2[2];
                      auVar46._12_4_ = pfVar1[3] + pfVar2[3];
                      *(undefined1 (*) [16])((long)pvVar34 + lVar39 + lVar37) = auVar46;
                      lVar39 = lVar39 + 0x10;
                      iVar36 = iVar36 + -1;
                    } while (iVar36 != 0);
                  }
                  uVar30 = uVar30 + 1;
                } while (uVar30 != uVar33);
                pMVar31 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                pMVar29 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish;
              }
              uVar32 = uVar32 + 1;
            } while (uVar32 < (ulong)(((long)pMVar29 - (long)pMVar31 >> 3) * -0x71c71c71c71c71c7));
          }
        }
        else {
          if (0 < (int)uVar6) {
            fVar4 = **(float **)(&this->field_0xd8 + (long)p_Var15);
            fVar5 = (*(float **)(&this->field_0xd8 + (long)p_Var15))[1];
            uVar32 = 0;
            do {
              if (0 < iVar41) {
                sVar8 = this_00->cstep;
                sVar10 = pMVar31[1].cstep;
                sVar11 = this_00->elemsize;
                pvVar34 = this_00->data;
                sVar12 = pMVar31[1].elemsize;
                pvVar35 = pMVar31[1].data;
                sVar13 = m->cstep;
                sVar14 = m->elemsize;
                pvVar38 = m->data;
                lVar37 = 0;
                iVar36 = iVar41;
                do {
                  pfVar1 = (float *)((long)pvVar38 + lVar37 + sVar13 * sVar14 * uVar32);
                  fVar18 = pfVar1[1];
                  fVar19 = pfVar1[2];
                  fVar20 = pfVar1[3];
                  pfVar2 = (float *)((long)pvVar35 + lVar37 + sVar10 * sVar12 * uVar32);
                  fVar21 = pfVar2[1];
                  fVar22 = pfVar2[2];
                  fVar23 = pfVar2[3];
                  pfVar3 = (float *)((long)pvVar34 + lVar37 + sVar8 * sVar11 * uVar32);
                  *pfVar3 = fVar5 * *pfVar2 + fVar4 * *pfVar1;
                  pfVar3[1] = fVar5 * fVar21 + fVar4 * fVar18;
                  pfVar3[2] = fVar5 * fVar22 + fVar4 * fVar19;
                  pfVar3[3] = fVar5 * fVar23 + fVar4 * fVar20;
                  lVar37 = lVar37 + 0x10;
                  iVar36 = iVar36 + -1;
                } while (iVar36 != 0);
              }
              uVar32 = uVar32 + 1;
            } while (uVar32 != uVar33);
            pMVar31 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          }
          pMVar29 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          if (2 < (ulong)(((long)pMVar29 - (long)pMVar31 >> 3) * -0x71c71c71c71c71c7)) {
            uVar32 = 2;
            do {
              if (0 < (int)uVar6) {
                pMVar31 = pMVar31 + uVar32;
                fVar4 = *(float *)(*(long *)(&this->field_0xd8 + (long)pp_Var9[-3]) + uVar32 * 4);
                uVar30 = 0;
                do {
                  if (0 < iVar41) {
                    lVar37 = this_00->cstep * this_00->elemsize * uVar30;
                    pvVar34 = this_00->data;
                    sVar8 = pMVar31->cstep;
                    sVar10 = pMVar31->elemsize;
                    pvVar35 = pMVar31->data;
                    lVar39 = 0;
                    iVar36 = iVar41;
                    do {
                      pfVar1 = (float *)((long)pvVar35 + lVar39 + sVar8 * sVar10 * uVar30);
                      fVar5 = pfVar1[1];
                      fVar18 = pfVar1[2];
                      fVar19 = pfVar1[3];
                      pfVar2 = (float *)((long)pvVar34 + lVar39 + lVar37);
                      fVar20 = pfVar2[1];
                      fVar21 = pfVar2[2];
                      fVar22 = pfVar2[3];
                      pfVar3 = (float *)((long)pvVar34 + lVar39 + lVar37);
                      *pfVar3 = fVar4 * *pfVar1 + *pfVar2;
                      pfVar3[1] = fVar4 * fVar5 + fVar20;
                      pfVar3[2] = fVar4 * fVar18 + fVar21;
                      pfVar3[3] = fVar4 * fVar19 + fVar22;
                      lVar39 = lVar39 + 0x10;
                      iVar36 = iVar36 + -1;
                    } while (iVar36 != 0);
                  }
                  uVar30 = uVar30 + 1;
                } while (uVar30 != uVar33);
                pMVar31 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                pMVar29 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish;
              }
              uVar32 = uVar32 + 1;
            } while (uVar32 < (ulong)(((long)pMVar29 - (long)pMVar31 >> 3) * -0x71c71c71c71c71c7));
          }
        }
      }
      if (*(int *)(&this->field_0xd0 + (long)pp_Var9[-3]) != 2) {
        return 0;
      }
      pMVar31 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (0 < (int)uVar6) {
        uVar32 = 0;
        do {
          if (0 < iVar41) {
            sVar8 = this_00->cstep;
            sVar10 = pMVar31[1].cstep;
            sVar11 = this_00->elemsize;
            pvVar34 = this_00->data;
            sVar12 = pMVar31[1].elemsize;
            pvVar35 = pMVar31[1].data;
            sVar13 = m->cstep;
            sVar14 = m->elemsize;
            pvVar38 = m->data;
            lVar37 = 0;
            iVar36 = iVar41;
            do {
              auVar43 = vmaxps_avx(*(undefined1 (*) [16])
                                    ((long)pvVar38 + lVar37 + sVar13 * sVar14 * uVar32),
                                   *(undefined1 (*) [16])
                                    ((long)pvVar35 + lVar37 + sVar10 * sVar12 * uVar32));
              *(undefined1 (*) [16])((long)pvVar34 + lVar37 + sVar8 * sVar11 * uVar32) = auVar43;
              lVar37 = lVar37 + 0x10;
              iVar36 = iVar36 + -1;
            } while (iVar36 != 0);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar33);
        pMVar31 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      }
      pMVar29 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if ((ulong)(((long)pMVar29 - (long)pMVar31 >> 3) * -0x71c71c71c71c71c7) < 3) {
        return 0;
      }
      uVar32 = 2;
      do {
        if (0 < (int)uVar6) {
          pMVar31 = pMVar31 + uVar32;
          uVar30 = 0;
          do {
            if (0 < iVar41) {
              lVar37 = this_00->cstep * this_00->elemsize * uVar30;
              pvVar34 = this_00->data;
              sVar8 = pMVar31->cstep;
              sVar10 = pMVar31->elemsize;
              pvVar35 = pMVar31->data;
              lVar39 = 0;
              iVar36 = iVar41;
              do {
                auVar43 = vmaxps_avx(*(undefined1 (*) [16])((long)pvVar34 + lVar39 + lVar37),
                                     *(undefined1 (*) [16])
                                      ((long)pvVar35 + lVar39 + sVar8 * sVar10 * uVar30));
                *(undefined1 (*) [16])((long)pvVar34 + lVar39 + lVar37) = auVar43;
                lVar39 = lVar39 + 0x10;
                iVar36 = iVar36 + -1;
              } while (iVar36 != 0);
            }
            uVar30 = uVar30 + 1;
          } while (uVar30 != uVar33);
          pMVar31 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pMVar29 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        uVar32 = uVar32 + 1;
      } while (uVar32 < (ulong)(((long)pMVar29 - (long)pMVar31 >> 3) * -0x71c71c71c71c71c7));
    }
    else if (iVar36 == 8) {
      if (iVar7 == 0) {
        pMVar31 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (0 < (int)uVar6) {
          uVar32 = 0;
          do {
            if (0 < iVar41) {
              sVar8 = pMVar31[1].cstep;
              sVar10 = m->cstep;
              sVar11 = m->elemsize;
              pvVar34 = m->data;
              sVar12 = pMVar31[1].elemsize;
              pvVar35 = pMVar31[1].data;
              sVar13 = this_00->cstep;
              sVar14 = this_00->elemsize;
              pvVar38 = this_00->data;
              lVar37 = 0;
              iVar36 = iVar41;
              do {
                pfVar1 = (float *)((long)pvVar35 + lVar37 + sVar8 * sVar12 * uVar32);
                pfVar2 = (float *)((long)pvVar34 + lVar37 + sVar10 * sVar11 * uVar32);
                auVar16._4_4_ = pfVar1[1] * pfVar2[1];
                auVar16._0_4_ = *pfVar1 * *pfVar2;
                auVar16._8_4_ = pfVar1[2] * pfVar2[2];
                auVar16._12_4_ = pfVar1[3] * pfVar2[3];
                auVar16._16_4_ = pfVar1[4] * pfVar2[4];
                auVar16._20_4_ = pfVar1[5] * pfVar2[5];
                auVar16._24_4_ = pfVar1[6] * pfVar2[6];
                auVar16._28_4_ = pfVar1[7];
                *(undefined1 (*) [32])((long)pvVar38 + lVar37 + sVar13 * sVar14 * uVar32) = auVar16;
                lVar37 = lVar37 + 0x20;
                iVar36 = iVar36 + -1;
              } while (iVar36 != 0);
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 != uVar33);
          pMVar31 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
        }
        pMVar29 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_finish;
        if (2 < (ulong)(((long)pMVar29 - (long)pMVar31 >> 3) * -0x71c71c71c71c71c7)) {
          uVar32 = 2;
          do {
            if (0 < (int)uVar6) {
              pMVar31 = pMVar31 + uVar32;
              uVar30 = 0;
              do {
                if (0 < iVar41) {
                  sVar8 = pMVar31->cstep;
                  sVar10 = pMVar31->elemsize;
                  pvVar34 = pMVar31->data;
                  lVar37 = this_00->cstep * this_00->elemsize * uVar30;
                  pvVar35 = this_00->data;
                  lVar39 = 0;
                  iVar36 = iVar41;
                  do {
                    pfVar1 = (float *)((long)pvVar34 + lVar39 + sVar8 * sVar10 * uVar30);
                    pfVar2 = (float *)((long)pvVar35 + lVar39 + lVar37);
                    auVar17._4_4_ = pfVar1[1] * pfVar2[1];
                    auVar17._0_4_ = *pfVar1 * *pfVar2;
                    auVar17._8_4_ = pfVar1[2] * pfVar2[2];
                    auVar17._12_4_ = pfVar1[3] * pfVar2[3];
                    auVar17._16_4_ = pfVar1[4] * pfVar2[4];
                    auVar17._20_4_ = pfVar1[5] * pfVar2[5];
                    auVar17._24_4_ = pfVar1[6] * pfVar2[6];
                    auVar17._28_4_ = pfVar1[7];
                    *(undefined1 (*) [32])((long)pvVar35 + lVar39 + lVar37) = auVar17;
                    lVar39 = lVar39 + 0x20;
                    iVar36 = iVar36 + -1;
                  } while (iVar36 != 0);
                }
                uVar30 = uVar30 + 1;
              } while (uVar30 != uVar33);
              pMVar31 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              pMVar29 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish;
            }
            uVar32 = uVar32 + 1;
          } while (uVar32 < (ulong)(((long)pMVar29 - (long)pMVar31 >> 3) * -0x71c71c71c71c71c7));
        }
      }
      p_Var15 = pp_Var9[-3];
      if (*(int *)(&this->field_0xd0 + (long)p_Var15) == 1) {
        pMVar31 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (*(int *)(&this->field_0x104 + (long)p_Var15) == 0) {
          if (0 < (int)uVar6) {
            uVar32 = 0;
            do {
              if (0 < iVar41) {
                sVar8 = pMVar31[1].cstep;
                sVar10 = m->cstep;
                sVar11 = m->elemsize;
                pvVar34 = m->data;
                sVar12 = pMVar31[1].elemsize;
                pvVar35 = pMVar31[1].data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar38 = this_00->data;
                lVar37 = 0;
                iVar36 = iVar41;
                do {
                  pfVar1 = (float *)((long)pvVar35 + lVar37 + sVar8 * sVar12 * uVar32);
                  pfVar2 = (float *)((long)pvVar34 + lVar37 + sVar10 * sVar11 * uVar32);
                  auVar47._0_4_ = *pfVar1 + *pfVar2;
                  auVar47._4_4_ = pfVar1[1] + pfVar2[1];
                  auVar47._8_4_ = pfVar1[2] + pfVar2[2];
                  auVar47._12_4_ = pfVar1[3] + pfVar2[3];
                  auVar47._16_4_ = pfVar1[4] + pfVar2[4];
                  auVar47._20_4_ = pfVar1[5] + pfVar2[5];
                  auVar47._24_4_ = pfVar1[6] + pfVar2[6];
                  auVar47._28_4_ = pfVar1[7] + pfVar2[7];
                  *(undefined1 (*) [32])((long)pvVar38 + lVar37 + sVar13 * sVar14 * uVar32) =
                       auVar47;
                  lVar37 = lVar37 + 0x20;
                  iVar36 = iVar36 + -1;
                } while (iVar36 != 0);
              }
              uVar32 = uVar32 + 1;
            } while (uVar32 != uVar33);
            pMVar31 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          }
          pMVar29 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          if (2 < (ulong)(((long)pMVar29 - (long)pMVar31 >> 3) * -0x71c71c71c71c71c7)) {
            uVar32 = 2;
            do {
              if (0 < (int)uVar6) {
                pMVar31 = pMVar31 + uVar32;
                uVar30 = 0;
                do {
                  if (0 < iVar41) {
                    sVar8 = pMVar31->cstep;
                    sVar10 = pMVar31->elemsize;
                    pvVar34 = pMVar31->data;
                    lVar37 = this_00->cstep * this_00->elemsize * uVar30;
                    pvVar35 = this_00->data;
                    lVar39 = 0;
                    iVar36 = iVar41;
                    do {
                      pfVar1 = (float *)((long)pvVar34 + lVar39 + sVar8 * sVar10 * uVar30);
                      pfVar2 = (float *)((long)pvVar35 + lVar39 + lVar37);
                      auVar48._0_4_ = *pfVar1 + *pfVar2;
                      auVar48._4_4_ = pfVar1[1] + pfVar2[1];
                      auVar48._8_4_ = pfVar1[2] + pfVar2[2];
                      auVar48._12_4_ = pfVar1[3] + pfVar2[3];
                      auVar48._16_4_ = pfVar1[4] + pfVar2[4];
                      auVar48._20_4_ = pfVar1[5] + pfVar2[5];
                      auVar48._24_4_ = pfVar1[6] + pfVar2[6];
                      auVar48._28_4_ = pfVar1[7] + pfVar2[7];
                      *(undefined1 (*) [32])((long)pvVar35 + lVar39 + lVar37) = auVar48;
                      lVar39 = lVar39 + 0x20;
                      iVar36 = iVar36 + -1;
                    } while (iVar36 != 0);
                  }
                  uVar30 = uVar30 + 1;
                } while (uVar30 != uVar33);
                pMVar31 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                pMVar29 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish;
              }
              uVar32 = uVar32 + 1;
            } while (uVar32 < (ulong)(((long)pMVar29 - (long)pMVar31 >> 3) * -0x71c71c71c71c71c7));
          }
        }
        else {
          if (0 < (int)uVar6) {
            fVar4 = **(float **)(&this->field_0xd8 + (long)p_Var15);
            in_register_0000125c = (*(float **)(&this->field_0xd8 + (long)p_Var15))[1];
            uVar32 = 0;
            do {
              if (0 < iVar41) {
                sVar8 = pMVar31[1].cstep;
                sVar10 = m->cstep;
                sVar11 = m->elemsize;
                pvVar34 = m->data;
                sVar12 = pMVar31[1].elemsize;
                pvVar35 = pMVar31[1].data;
                sVar13 = this_00->cstep;
                sVar14 = this_00->elemsize;
                pvVar38 = this_00->data;
                lVar37 = 0;
                iVar36 = iVar41;
                do {
                  pfVar1 = (float *)((long)pvVar34 + lVar37 + sVar10 * sVar11 * uVar32);
                  fVar5 = pfVar1[1];
                  fVar18 = pfVar1[2];
                  fVar19 = pfVar1[3];
                  fVar20 = pfVar1[4];
                  fVar21 = pfVar1[5];
                  fVar22 = pfVar1[6];
                  pfVar2 = (float *)((long)pvVar35 + lVar37 + sVar8 * sVar12 * uVar32);
                  fVar23 = pfVar2[1];
                  fVar24 = pfVar2[2];
                  fVar25 = pfVar2[3];
                  fVar26 = pfVar2[4];
                  fVar27 = pfVar2[5];
                  fVar28 = pfVar2[6];
                  in_register_0000129c = in_register_000012dc + in_register_0000129c;
                  pfVar3 = (float *)((long)pvVar38 + lVar37 + sVar13 * sVar14 * uVar32);
                  *pfVar3 = in_register_0000125c * *pfVar2 + fVar4 * *pfVar1;
                  pfVar3[1] = in_register_0000125c * fVar23 + fVar4 * fVar5;
                  pfVar3[2] = in_register_0000125c * fVar24 + fVar4 * fVar18;
                  pfVar3[3] = in_register_0000125c * fVar25 + fVar4 * fVar19;
                  pfVar3[4] = in_register_0000125c * fVar26 + fVar4 * fVar20;
                  pfVar3[5] = in_register_0000125c * fVar27 + fVar4 * fVar21;
                  pfVar3[6] = in_register_0000125c * fVar28 + fVar4 * fVar22;
                  pfVar3[7] = in_register_0000129c;
                  lVar37 = lVar37 + 0x20;
                  iVar36 = iVar36 + -1;
                } while (iVar36 != 0);
              }
              uVar32 = uVar32 + 1;
            } while (uVar32 != uVar33);
            pMVar31 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_start;
          }
          pMVar29 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
          if (2 < (ulong)(((long)pMVar29 - (long)pMVar31 >> 3) * -0x71c71c71c71c71c7)) {
            uVar32 = 2;
            do {
              if (0 < (int)uVar6) {
                pMVar31 = pMVar31 + uVar32;
                fVar4 = *(float *)(*(long *)(&this->field_0xd8 + (long)pp_Var9[-3]) + uVar32 * 4);
                uVar30 = 0;
                do {
                  if (0 < iVar41) {
                    sVar8 = pMVar31->cstep;
                    sVar10 = pMVar31->elemsize;
                    pvVar34 = pMVar31->data;
                    lVar37 = this_00->cstep * this_00->elemsize * uVar30;
                    pvVar35 = this_00->data;
                    lVar39 = 0;
                    iVar36 = iVar41;
                    do {
                      pfVar1 = (float *)((long)pvVar34 + lVar39 + sVar8 * sVar10 * uVar30);
                      fVar5 = pfVar1[1];
                      fVar18 = pfVar1[2];
                      fVar19 = pfVar1[3];
                      fVar20 = pfVar1[4];
                      fVar21 = pfVar1[5];
                      fVar22 = pfVar1[6];
                      pfVar2 = (float *)((long)pvVar35 + lVar39 + lVar37);
                      fVar23 = pfVar2[1];
                      fVar24 = pfVar2[2];
                      fVar25 = pfVar2[3];
                      fVar26 = pfVar2[4];
                      fVar27 = pfVar2[5];
                      fVar28 = pfVar2[6];
                      in_register_0000125c = in_register_0000125c + pfVar2[7];
                      pfVar3 = (float *)((long)pvVar35 + lVar39 + lVar37);
                      *pfVar3 = fVar4 * *pfVar1 + *pfVar2;
                      pfVar3[1] = fVar4 * fVar5 + fVar23;
                      pfVar3[2] = fVar4 * fVar18 + fVar24;
                      pfVar3[3] = fVar4 * fVar19 + fVar25;
                      pfVar3[4] = fVar4 * fVar20 + fVar26;
                      pfVar3[5] = fVar4 * fVar21 + fVar27;
                      pfVar3[6] = fVar4 * fVar22 + fVar28;
                      pfVar3[7] = in_register_0000125c;
                      lVar39 = lVar39 + 0x20;
                      iVar36 = iVar36 + -1;
                    } while (iVar36 != 0);
                  }
                  uVar30 = uVar30 + 1;
                } while (uVar30 != uVar33);
                pMVar31 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_start;
                pMVar29 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish;
              }
              uVar32 = uVar32 + 1;
            } while (uVar32 < (ulong)(((long)pMVar29 - (long)pMVar31 >> 3) * -0x71c71c71c71c71c7));
          }
        }
      }
      if (*(int *)(&this->field_0xd0 + (long)pp_Var9[-3]) != 2) {
        return 0;
      }
      pMVar31 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (0 < (int)uVar6) {
        uVar32 = 0;
        do {
          if (0 < iVar41) {
            sVar8 = pMVar31[1].cstep;
            sVar10 = m->cstep;
            sVar11 = m->elemsize;
            pvVar34 = m->data;
            sVar12 = pMVar31[1].elemsize;
            pvVar35 = pMVar31[1].data;
            sVar13 = this_00->cstep;
            sVar14 = this_00->elemsize;
            pvVar38 = this_00->data;
            lVar37 = 0;
            iVar36 = iVar41;
            do {
              auVar16 = vmaxps_avx(*(undefined1 (*) [32])
                                    ((long)pvVar34 + lVar37 + sVar10 * sVar11 * uVar32),
                                   *(undefined1 (*) [32])
                                    ((long)pvVar35 + lVar37 + sVar8 * sVar12 * uVar32));
              *(undefined1 (*) [32])((long)pvVar38 + lVar37 + sVar13 * sVar14 * uVar32) = auVar16;
              lVar37 = lVar37 + 0x20;
              iVar36 = iVar36 + -1;
            } while (iVar36 != 0);
          }
          uVar32 = uVar32 + 1;
        } while (uVar32 != uVar33);
        pMVar31 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
      }
      pMVar29 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_finish;
      if ((ulong)(((long)pMVar29 - (long)pMVar31 >> 3) * -0x71c71c71c71c71c7) < 3) {
        return 0;
      }
      uVar32 = 2;
      do {
        if (0 < (int)uVar6) {
          pMVar31 = pMVar31 + uVar32;
          uVar30 = 0;
          do {
            if (0 < iVar41) {
              sVar8 = pMVar31->cstep;
              sVar10 = pMVar31->elemsize;
              pvVar34 = pMVar31->data;
              lVar37 = this_00->cstep * this_00->elemsize * uVar30;
              pvVar35 = this_00->data;
              lVar39 = 0;
              iVar36 = iVar41;
              do {
                auVar16 = vmaxps_avx(*(undefined1 (*) [32])((long)pvVar35 + lVar39 + lVar37),
                                     *(undefined1 (*) [32])
                                      ((long)pvVar34 + lVar39 + sVar8 * sVar10 * uVar30));
                *(undefined1 (*) [32])((long)pvVar35 + lVar39 + lVar37) = auVar16;
                lVar39 = lVar39 + 0x20;
                iVar36 = iVar36 + -1;
              } while (iVar36 != 0);
            }
            uVar30 = uVar30 + 1;
          } while (uVar30 != uVar33);
          pMVar31 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          pMVar29 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_finish;
        }
        uVar32 = uVar32 + 1;
      } while (uVar32 < (ulong)(((long)pMVar29 - (long)pMVar31 >> 3) * -0x71c71c71c71c71c7));
    }
    else {
      if (iVar7 == 0) {
        pMVar31 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        if (0 < (int)uVar6) {
          pvVar35 = m->data;
          sVar10 = m->cstep;
          pvVar38 = pMVar31[1].data;
          sVar11 = pMVar31[1].cstep;
          sVar12 = this_00->elemsize;
          sVar13 = pMVar31[1].elemsize;
          sVar14 = m->elemsize;
          uVar32 = 0;
          do {
            if (0 < iVar41) {
              lVar37 = 0;
              uVar42 = iVar41 + 1;
              do {
                *(float *)((long)pvVar34 + lVar37) =
                     *(float *)((long)pvVar38 + lVar37) * *(float *)((long)pvVar35 + lVar37);
                uVar42 = uVar42 - 1;
                lVar37 = lVar37 + 4;
              } while (1 < uVar42);
            }
            uVar32 = uVar32 + 1;
            pvVar34 = (void *)((long)pvVar34 + sVar12 * sVar8);
            pvVar38 = (void *)((long)pvVar38 + sVar11 * sVar13);
            pvVar35 = (void *)((long)pvVar35 + sVar10 * sVar14);
          } while (uVar32 != uVar33);
        }
        uVar32 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)pMVar31 >> 3) *
                 -0x71c71c71c71c71c7;
        if (2 < uVar32) {
          uVar30 = 2;
          do {
            if (0 < (int)uVar6) {
              pvVar34 = pMVar31[uVar30].data;
              sVar10 = pMVar31[uVar30].cstep;
              sVar11 = pMVar31[uVar30].elemsize;
              pvVar35 = this_00->data;
              sVar12 = this_00->elemsize;
              uVar40 = 0;
              do {
                if (0 < iVar41) {
                  lVar37 = 0;
                  uVar42 = iVar41 + 1;
                  do {
                    *(float *)((long)pvVar35 + lVar37) =
                         *(float *)((long)pvVar35 + lVar37) * *(float *)((long)pvVar34 + lVar37);
                    uVar42 = uVar42 - 1;
                    lVar37 = lVar37 + 4;
                  } while (1 < uVar42);
                }
                uVar40 = uVar40 + 1;
                pvVar35 = (void *)((long)pvVar35 + sVar12 * sVar8);
                pvVar34 = (void *)((long)pvVar34 + sVar10 * sVar11);
              } while (uVar40 != uVar33);
            }
            uVar30 = uVar30 + 1;
          } while (uVar30 != uVar32);
        }
      }
      p_Var15 = pp_Var9[-3];
      if (*(int *)(&this->field_0xd0 + (long)p_Var15) == 1) {
        if (*(int *)(&this->field_0x104 + (long)p_Var15) == 0) {
          pMVar31 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          if (0 < (int)uVar6) {
            pvVar34 = m->data;
            sVar10 = m->cstep;
            pvVar35 = pMVar31[1].data;
            sVar11 = pMVar31[1].cstep;
            pvVar38 = this_00->data;
            sVar12 = this_00->elemsize;
            sVar13 = pMVar31[1].elemsize;
            sVar14 = m->elemsize;
            uVar32 = 0;
            do {
              if (0 < iVar41) {
                lVar37 = 0;
                uVar42 = iVar41 + 1;
                do {
                  *(float *)((long)pvVar38 + lVar37) =
                       *(float *)((long)pvVar35 + lVar37) + *(float *)((long)pvVar34 + lVar37);
                  uVar42 = uVar42 - 1;
                  lVar37 = lVar37 + 4;
                } while (1 < uVar42);
              }
              uVar32 = uVar32 + 1;
              pvVar38 = (void *)((long)pvVar38 + sVar12 * sVar8);
              pvVar35 = (void *)((long)pvVar35 + sVar11 * sVar13);
              pvVar34 = (void *)((long)pvVar34 + sVar10 * sVar14);
            } while (uVar32 != uVar33);
          }
          uVar32 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar31 >> 3) *
                   -0x71c71c71c71c71c7;
          if (2 < uVar32) {
            uVar30 = 2;
            do {
              if (0 < (int)uVar6) {
                pvVar34 = pMVar31[uVar30].data;
                sVar10 = pMVar31[uVar30].cstep;
                sVar11 = pMVar31[uVar30].elemsize;
                pvVar35 = this_00->data;
                sVar12 = this_00->elemsize;
                uVar40 = 0;
                do {
                  if (0 < iVar41) {
                    lVar37 = 0;
                    uVar42 = iVar41 + 1;
                    do {
                      *(float *)((long)pvVar35 + lVar37) =
                           *(float *)((long)pvVar35 + lVar37) + *(float *)((long)pvVar34 + lVar37);
                      uVar42 = uVar42 - 1;
                      lVar37 = lVar37 + 4;
                    } while (1 < uVar42);
                  }
                  uVar40 = uVar40 + 1;
                  pvVar35 = (void *)((long)pvVar35 + sVar12 * sVar8);
                  pvVar34 = (void *)((long)pvVar34 + sVar10 * sVar11);
                } while (uVar40 != uVar33);
              }
              uVar30 = uVar30 + 1;
            } while (uVar30 != uVar32);
          }
        }
        else {
          pMVar31 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          if (0 < (int)uVar6) {
            fVar4 = **(float **)(&this->field_0xd8 + (long)p_Var15);
            fVar5 = (*(float **)(&this->field_0xd8 + (long)p_Var15))[1];
            pvVar34 = m->data;
            sVar10 = m->cstep;
            pvVar35 = pMVar31[1].data;
            sVar11 = pMVar31[1].cstep;
            pvVar38 = this_00->data;
            sVar12 = this_00->elemsize;
            sVar13 = pMVar31[1].elemsize;
            sVar14 = m->elemsize;
            uVar32 = 0;
            do {
              if (0 < iVar41) {
                lVar37 = 0;
                uVar42 = iVar41 + 1;
                do {
                  *(float *)((long)pvVar38 + lVar37) =
                       fVar5 * *(float *)((long)pvVar35 + lVar37) +
                       fVar4 * *(float *)((long)pvVar34 + lVar37);
                  uVar42 = uVar42 - 1;
                  lVar37 = lVar37 + 4;
                } while (1 < uVar42);
              }
              uVar32 = uVar32 + 1;
              pvVar38 = (void *)((long)pvVar38 + sVar12 * sVar8);
              pvVar35 = (void *)((long)pvVar35 + sVar11 * sVar13);
              pvVar34 = (void *)((long)pvVar34 + sVar10 * sVar14);
            } while (uVar32 != uVar33);
          }
          uVar32 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                          _M_impl.super__Vector_impl_data._M_finish - (long)pMVar31 >> 3) *
                   -0x71c71c71c71c71c7;
          if (2 < uVar32) {
            uVar30 = 2;
            do {
              if (0 < (int)uVar6) {
                fVar4 = *(float *)(*(long *)(&this->field_0xd8 + (long)pp_Var9[-3]) + uVar30 * 4);
                pvVar34 = pMVar31[uVar30].data;
                sVar10 = pMVar31[uVar30].cstep;
                sVar11 = pMVar31[uVar30].elemsize;
                pvVar35 = this_00->data;
                sVar12 = this_00->elemsize;
                uVar40 = 0;
                do {
                  if (0 < iVar41) {
                    lVar37 = 0;
                    uVar42 = iVar41 + 1;
                    do {
                      *(float *)((long)pvVar35 + lVar37) =
                           fVar4 * *(float *)((long)pvVar34 + lVar37) +
                           *(float *)((long)pvVar35 + lVar37);
                      uVar42 = uVar42 - 1;
                      lVar37 = lVar37 + 4;
                    } while (1 < uVar42);
                  }
                  uVar40 = uVar40 + 1;
                  pvVar35 = (void *)((long)pvVar35 + sVar12 * sVar8);
                  pvVar34 = (void *)((long)pvVar34 + sVar10 * sVar11);
                } while (uVar40 != uVar33);
              }
              uVar30 = uVar30 + 1;
            } while (uVar30 != uVar32);
          }
        }
      }
      if (*(int *)(&this->field_0xd0 + (long)pp_Var9[-3]) != 2) {
        return 0;
      }
      pMVar31 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
                super__Vector_impl_data._M_start;
      if (0 < (int)uVar6) {
        pvVar34 = m->data;
        sVar10 = m->cstep;
        pvVar35 = pMVar31[1].data;
        sVar11 = pMVar31[1].cstep;
        pvVar38 = this_00->data;
        sVar12 = this_00->elemsize;
        sVar13 = pMVar31[1].elemsize;
        sVar14 = m->elemsize;
        uVar32 = 0;
        do {
          if (0 < iVar41) {
            lVar37 = 0;
            uVar42 = iVar41 + 1;
            do {
              auVar43 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar35 + lVar37)),
                                   ZEXT416(*(uint *)((long)pvVar34 + lVar37)));
              *(int *)((long)pvVar38 + lVar37) = auVar43._0_4_;
              uVar42 = uVar42 - 1;
              lVar37 = lVar37 + 4;
            } while (1 < uVar42);
          }
          uVar32 = uVar32 + 1;
          pvVar38 = (void *)((long)pvVar38 + sVar12 * sVar8);
          pvVar35 = (void *)((long)pvVar35 + sVar11 * sVar13);
          pvVar34 = (void *)((long)pvVar34 + sVar10 * sVar14);
        } while (uVar32 != uVar33);
      }
      uVar32 = ((long)(bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>).
                      _M_impl.super__Vector_impl_data._M_finish - (long)pMVar31 >> 3) *
               -0x71c71c71c71c71c7;
      if (uVar32 < 3) {
        return 0;
      }
      uVar30 = 2;
      do {
        if (0 < (int)uVar6) {
          pvVar34 = pMVar31[uVar30].data;
          sVar10 = pMVar31[uVar30].cstep;
          sVar11 = pMVar31[uVar30].elemsize;
          pvVar35 = this_00->data;
          sVar12 = this_00->elemsize;
          uVar40 = 0;
          do {
            if (0 < iVar41) {
              lVar37 = 0;
              uVar42 = iVar41 + 1;
              do {
                auVar43 = vmaxss_avx(ZEXT416(*(uint *)((long)pvVar35 + lVar37)),
                                     ZEXT416(*(uint *)((long)pvVar34 + lVar37)));
                *(int *)((long)pvVar35 + lVar37) = auVar43._0_4_;
                uVar42 = uVar42 - 1;
                lVar37 = lVar37 + 4;
              } while (1 < uVar42);
            }
            uVar40 = uVar40 + 1;
            pvVar35 = (void *)((long)pvVar35 + sVar12 * sVar8);
            pvVar34 = (void *)((long)pvVar34 + sVar10 * sVar11);
          } while (uVar40 != uVar33);
        }
        uVar30 = uVar30 + 1;
      } while (uVar30 != uVar32);
    }
    return 0;
  }
  return -100;
}

Assistant:

int Eltwise_x86_avx::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    int elempack = bottom_blob.elempack;
    int size = w * h;

    Mat& top_blob = top_blobs[0];
    top_blob.create_like(bottom_blob, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

#if __SSE2__
#if __AVX__
    if (elempack == 8)
    {
        if (op_type == Operation_PROD)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_mul_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_mul_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
                }
            }
        }
        if (op_type == Operation_SUM)
        {
            if (coeffs.w == 0)
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr1);
                        _p = _mm256_add_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        ptr1 += 8;
                        outptr += 8;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m256 _p = _mm256_loadu_ps(outptr);
                            __m256 _p1 = _mm256_loadu_ps(ptr);
                            _p = _mm256_add_ps(_p, _p1);
                            _mm256_storeu_ps(outptr, _p);

                            ptr += 8;
                            outptr += 8;
                        }
                    }
                }
            }
            else
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                __m256 _coeff0 = _mm256_set1_ps(coeffs[0]);
                __m256 _coeff1 = _mm256_set1_ps(coeffs[1]);
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(ptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr1);
                        _p = _mm256_mul_ps(_p, _coeff0);
                        _p = _mm256_comp_fmadd_ps(_p1, _coeff1, _p);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        ptr1 += 8;
                        outptr += 8;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    __m256 _coeff = _mm256_set1_ps(coeffs[b]);
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m256 _p = _mm256_loadu_ps(outptr);
                            __m256 _p1 = _mm256_loadu_ps(ptr);
                            _p = _mm256_comp_fmadd_ps(_p1, _coeff, _p);
                            _mm256_storeu_ps(outptr, _p);

                            ptr += 8;
                            outptr += 8;
                        }
                    }
                }
            }
        }
        if (op_type == Operation_MAX)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m256 _p = _mm256_loadu_ps(ptr);
                    __m256 _p1 = _mm256_loadu_ps(ptr1);
                    _p = _mm256_max_ps(_p, _p1);
                    _mm256_storeu_ps(outptr, _p);

                    ptr += 8;
                    ptr1 += 8;
                    outptr += 8;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m256 _p = _mm256_loadu_ps(outptr);
                        __m256 _p1 = _mm256_loadu_ps(ptr);
                        _p = _mm256_max_ps(_p, _p1);
                        _mm256_storeu_ps(outptr, _p);

                        ptr += 8;
                        outptr += 8;
                    }
                }
            }
        }

        return 0;
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (op_type == Operation_PROD)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_mul_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_mul_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
                }
            }
        }
        if (op_type == Operation_SUM)
        {
            if (coeffs.w == 0)
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        __m128 _p1 = _mm_load_ps(ptr1);
                        _p = _mm_add_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        ptr1 += 4;
                        outptr += 4;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m128 _p = _mm_load_ps(outptr);
                            __m128 _p1 = _mm_load_ps(ptr);
                            _p = _mm_add_ps(_p, _p1);
                            _mm_store_ps(outptr, _p);

                            ptr += 4;
                            outptr += 4;
                        }
                    }
                }
            }
            else
            {
                // first blob
                const Mat& bottom_blob1 = bottom_blobs[1];
                __m128 _coeff0 = _mm_set1_ps(coeffs[0]);
                __m128 _coeff1 = _mm_set1_ps(coeffs[1]);
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob.channel(q);
                    const float* ptr1 = bottom_blob1.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(ptr);
                        __m128 _p1 = _mm_load_ps(ptr1);
                        _p = _mm_mul_ps(_p, _coeff0);
                        _p1 = _mm_mul_ps(_p1, _coeff1);
                        _p = _mm_add_ps(_p1, _p);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        ptr1 += 4;
                        outptr += 4;
                    }
                }

                for (size_t b = 2; b < bottom_blobs.size(); b++)
                {
                    const Mat& bottom_blob2 = bottom_blobs[b];
                    __m128 _coeff = _mm_set1_ps(coeffs[b]);
                    #pragma omp parallel for num_threads(opt.num_threads)
                    for (int q = 0; q < channels; q++)
                    {
                        const float* ptr = bottom_blob2.channel(q);
                        float* outptr = top_blob.channel(q);

                        for (int i = 0; i < size; i++)
                        {
                            __m128 _p1 = _mm_load_ps(ptr);
                            __m128 _p = _mm_load_ps(outptr);
                            _p1 = _mm_mul_ps(_p1, _coeff);
                            _p = _mm_add_ps(_p1, _p);
                            _mm_store_ps(outptr, _p);

                            ptr += 4;
                            outptr += 4;
                        }
                    }
                }
            }
        }
        if (op_type == Operation_MAX)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);

                for (int i = 0; i < size; i++)
                {
                    __m128 _p = _mm_load_ps(ptr);
                    __m128 _p1 = _mm_load_ps(ptr1);
                    _p = _mm_max_ps(_p, _p1);
                    _mm_store_ps(outptr, _p);

                    ptr += 4;
                    ptr1 += 4;
                    outptr += 4;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    for (int i = 0; i < size; i++)
                    {
                        __m128 _p = _mm_load_ps(outptr);
                        __m128 _p1 = _mm_load_ps(ptr);
                        _p = _mm_max_ps(_p, _p1);
                        _mm_store_ps(outptr, _p);

                        ptr += 4;
                        outptr += 4;
                    }
                }
            }
        }

        return 0;
    }
#endif // __SSE2__

    if (op_type == Operation_PROD)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);
            int remain = size;
            for (; remain > 0; remain--)
            {
                *outptr = *ptr * *ptr1;

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;

                for (; remain > 0; remain--)
                {
                    *outptr *= *ptr;

                    ptr++;
                    outptr++;
                }
            }
        }
    }
    if (op_type == Operation_SUM)
    {
        if (coeffs.w == 0)
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;

                for (; remain > 0; remain--)
                {
                    *outptr = *ptr + *ptr1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int remain = size;
                    for (; remain > 0; remain--)
                    {
                        *outptr += *ptr;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
        else
        {
            // first blob
            const Mat& bottom_blob1 = bottom_blobs[1];
            float coeff0 = coeffs[0];
            float coeff1 = coeffs[1];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob.channel(q);
                const float* ptr1 = bottom_blob1.channel(q);
                float* outptr = top_blob.channel(q);
                int remain = size;
                for (; remain > 0; remain--)
                {
                    *outptr = *ptr * coeff0 + *ptr1 * coeff1;

                    ptr++;
                    ptr1++;
                    outptr++;
                }
            }

            for (size_t b = 2; b < bottom_blobs.size(); b++)
            {
                const Mat& bottom_blob2 = bottom_blobs[b];
                float coeff = coeffs[b];
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int q = 0; q < channels; q++)
                {
                    const float* ptr = bottom_blob2.channel(q);
                    float* outptr = top_blob.channel(q);

                    int remain = size;
                    for (; remain > 0; remain--)
                    {
                        *outptr += *ptr * coeff;

                        ptr++;
                        outptr++;
                    }
                }
            }
        }
    }
    if (op_type == Operation_MAX)
    {
        // first blob
        const Mat& bottom_blob1 = bottom_blobs[1];
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            const float* ptr1 = bottom_blob1.channel(q);
            float* outptr = top_blob.channel(q);

            int remain = size;
            for (; remain > 0; remain--)
            {
                *outptr = std::max(*ptr, *ptr1);

                ptr++;
                ptr1++;
                outptr++;
            }
        }

        for (size_t b = 2; b < bottom_blobs.size(); b++)
        {
            const Mat& bottom_blob2 = bottom_blobs[b];
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const float* ptr = bottom_blob2.channel(q);
                float* outptr = top_blob.channel(q);

                int remain = size;
                for (; remain > 0; remain--)
                {
                    *outptr = std::max(*ptr, *outptr);

                    ptr++;
                    outptr++;
                }
            }
        }
    }

    return 0;
}